

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O0

Uint8 __thiscall SDL2pp::Surface::GetAlphaMod(Surface *this)

{
  int iVar1;
  Exception *this_00;
  Uint8 local_11;
  Surface *pSStack_10;
  Uint8 alpha;
  Surface *this_local;
  
  pSStack_10 = this;
  iVar1 = SDL_GetSurfaceAlphaMod(this->surface_,&local_11);
  if (iVar1 != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x50);
    Exception::Exception(this_00,"SDL_GetSurfaceAlphaMod");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return local_11;
}

Assistant:

Uint8 Surface::GetAlphaMod() const {
	Uint8 alpha;
	if (SDL_GetSurfaceAlphaMod(surface_, &alpha) != 0)
		throw Exception("SDL_GetSurfaceAlphaMod");
	return alpha;
}